

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

bool absl::lts_20250127::anon_unknown_58::IsSubcordInCordAt
               (CharIterator haystack,CharIterator needle_begin,CharIterator needle_end)

{
  CordRepBtree **this;
  bool bVar1;
  unsigned_long *puVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __y;
  size_type local_48;
  size_type local_40;
  size_type local_38;
  unsigned_long min_length;
  string_view needle_chunk;
  string_view haystack_chunk;
  
  this = haystack.chunk_iterator_.btree_reader_.navigator_.node_ + 0xb;
  while( true ) {
    bVar1 = Cord::CharIterator::operator!=
                      ((CharIterator *)this,
                       (CharIterator *)
                       (needle_begin.chunk_iterator_.btree_reader_.navigator_.node_ + 0xb));
    if (!bVar1) {
      return true;
    }
    join_0x00000010_0x00000000_ = Cord::ChunkRemaining((CharIterator *)&stack0x00000008);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                      ((basic_string_view<char,_std::char_traits<char>_> *)&needle_chunk._M_str);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    _min_length = Cord::ChunkRemaining((CharIterator *)this);
    local_40 = std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&needle_chunk._M_str);
    local_48 = std::basic_string_view<char,_std::char_traits<char>_>::size
                         ((basic_string_view<char,_std::char_traits<char>_> *)&min_length);
    puVar2 = std::min<unsigned_long>(&local_40,&local_48);
    local_38 = *puVar2;
    __x = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&needle_chunk._M_str,0,
                     local_38);
    __y = std::basic_string_view<char,_std::char_traits<char>_>::substr
                    ((basic_string_view<char,_std::char_traits<char>_> *)&min_length,0,local_38);
    bVar1 = std::operator!=(__x,__y);
    if (bVar1) {
      return false;
    }
    Cord::Advance((CharIterator *)&stack0x00000008,local_38);
    Cord::Advance((Nonnull<CharIterator_*>)this,local_38);
  }
  __assert_fail("!haystack_chunk.empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/strings/cord.cc"
                ,0x50f,
                "bool absl::lts_20250127::(anonymous namespace)::IsSubcordInCordAt(absl::Cord::CharIterator, absl::Cord::CharIterator, absl::Cord::CharIterator)"
               );
}

Assistant:

bool IsSubcordInCordAt(absl::Cord::CharIterator haystack,
                       absl::Cord::CharIterator needle_begin,
                       absl::Cord::CharIterator needle_end) {
  while (needle_begin != needle_end) {
    auto haystack_chunk = absl::Cord::ChunkRemaining(haystack);
    assert(!haystack_chunk.empty());
    auto needle_chunk = absl::Cord::ChunkRemaining(needle_begin);
    auto min_length = std::min(haystack_chunk.size(), needle_chunk.size());
    if (haystack_chunk.substr(0, min_length) !=
        needle_chunk.substr(0, min_length)) {
      return false;
    }
    absl::Cord::Advance(&haystack, min_length);
    absl::Cord::Advance(&needle_begin, min_length);
  }
  return true;
}